

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall Catch::CompactReporter::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  IColourImpl *pIVar1;
  Colour colour;
  Colour local_9;
  
  if ((this->result->m_info).capturedExpression._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,";",1);
    local_9.m_moved = false;
    pIVar1 = Colour::impl();
    (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream," expression was:",0x10);
    Colour::~Colour(&local_9);
    printOriginalExpression(this);
    return;
  }
  return;
}

Assistant:

void printExpressionWas() {
                if( result.hasExpression() ) {
                    stream << ";";
                    {
                        Colour colour( dimColour() );
                        stream << " expression was:";
                    }
                    printOriginalExpression();
                }
            }